

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  ostream *poVar1;
  ofstream ppm;
  ofstream *in_stack_ffffffffffff5520;
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,"output_compiletime.ppm",0x10);
  this = std::operator<<(local_210,"P3\n");
  poVar1 = (ostream *)std::ostream::operator<<(this,0x78);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::operator<<(poVar1,"\n255\n");
  get_frame_0();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_1();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_2();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_3();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_4();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_5();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_6();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_7();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_8();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_9();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_10();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  get_frame_11();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>
            (in_stack_ffffffffffff5520,(OutputImage<cert::Color,_120UL,_10UL> *)this);
  std::ofstream::~ofstream(local_210);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
	std::ofstream ppm ("output_compiletime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, get_frame_0 ());
	print_image (ppm, get_frame_1 ());
	print_image (ppm, get_frame_2 ());
	print_image (ppm, get_frame_3 ());
	print_image (ppm, get_frame_4 ());
	print_image (ppm, get_frame_5 ());
	print_image (ppm, get_frame_6 ());
	print_image (ppm, get_frame_7 ());
	print_image (ppm, get_frame_8 ());
	print_image (ppm, get_frame_9 ());
	print_image (ppm, get_frame_10 ());
	print_image (ppm, get_frame_11 ());
}